

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O0

Result<wasm::WATParser::Ok> *
wasm::WATParser::anon_unknown_11::valtype<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
          (Result<wasm::WATParser::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  ParseDeclsCtx *pPVar1;
  bool bVar2;
  Ok *u;
  basic_string_view<char,_std::char_traits<char>_> expected;
  allocator<char> local_161;
  string local_160;
  Err local_140;
  uint local_11c;
  Err local_118;
  Err *local_f8;
  Err *err;
  MaybeResult<wasm::WATParser::Ok> _val;
  undefined1 local_b8 [8];
  MaybeResult<wasm::WATParser::Ok> type;
  Ok local_71;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  Ok local_59;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  Ok local_41;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  Ok local_29;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  ParseDeclsCtx *local_18;
  ParseDeclsCtx *ctx_local;
  
  local_18 = ctx;
  ctx_local = (ParseDeclsCtx *)__return_storage_ptr__;
  local_28 = sv("i32",3);
  bVar2 = ParseInput::takeKeyword(&ctx->in,local_28);
  pPVar1 = local_18;
  if (bVar2) {
    NullTypeParserCtx::makeI32((NullTypeParserCtx *)local_18);
    Result<wasm::WATParser::Ok>::Result<wasm::WATParser::Ok>(__return_storage_ptr__,&local_29);
  }
  else {
    local_40 = sv("i64",3);
    bVar2 = ParseInput::takeKeyword(&pPVar1->in,local_40);
    pPVar1 = local_18;
    if (bVar2) {
      NullTypeParserCtx::makeI64((NullTypeParserCtx *)local_18);
      Result<wasm::WATParser::Ok>::Result<wasm::WATParser::Ok>(__return_storage_ptr__,&local_41);
    }
    else {
      local_58 = sv("f32",3);
      bVar2 = ParseInput::takeKeyword(&pPVar1->in,local_58);
      pPVar1 = local_18;
      if (bVar2) {
        NullTypeParserCtx::makeF32((NullTypeParserCtx *)local_18);
        Result<wasm::WATParser::Ok>::Result<wasm::WATParser::Ok>(__return_storage_ptr__,&local_59);
      }
      else {
        local_70 = sv("f64",3);
        bVar2 = ParseInput::takeKeyword(&pPVar1->in,local_70);
        pPVar1 = local_18;
        if (bVar2) {
          NullTypeParserCtx::makeF64((NullTypeParserCtx *)local_18);
          Result<wasm::WATParser::Ok>::Result<wasm::WATParser::Ok>(__return_storage_ptr__,&local_71)
          ;
        }
        else {
          expected = sv("v128",4);
          bVar2 = ParseInput::takeKeyword(&pPVar1->in,expected);
          if (bVar2) {
            NullTypeParserCtx::makeV128((NullTypeParserCtx *)local_18);
            Result<wasm::WATParser::Ok>::Result<wasm::WATParser::Ok>
                      (__return_storage_ptr__,
                       (Ok *)((long)&type.val.
                                     super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                     .
                                     super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                     .
                                     super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                     .
                                     super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                     .
                                     super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             + 0x27));
          }
          else {
            reftype<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
                      ((MaybeResult<wasm::WATParser::Ok> *)local_b8,local_18);
            bVar2 = WATParser::MaybeResult::operator_cast_to_bool((MaybeResult *)local_b8);
            pPVar1 = local_18;
            if (bVar2) {
              MaybeResult<wasm::WATParser::Ok>::MaybeResult
                        ((MaybeResult<wasm::WATParser::Ok> *)&err,
                         (MaybeResult<wasm::WATParser::Ok> *)local_b8);
              local_f8 = MaybeResult<wasm::WATParser::Ok>::getErr
                                   ((MaybeResult<wasm::WATParser::Ok> *)&err);
              bVar2 = local_f8 != (Err *)0x0;
              if (bVar2) {
                WATParser::Err::Err(&local_118,local_f8);
                Result<wasm::WATParser::Ok>::Result(__return_storage_ptr__,&local_118);
                WATParser::Err::~Err(&local_118);
              }
              local_11c = (uint)bVar2;
              MaybeResult<wasm::WATParser::Ok>::~MaybeResult
                        ((MaybeResult<wasm::WATParser::Ok> *)&err);
              if (local_11c == 0) {
                u = MaybeResult<wasm::WATParser::Ok>::operator*
                              ((MaybeResult<wasm::WATParser::Ok> *)local_b8);
                Result<wasm::WATParser::Ok>::Result<wasm::WATParser::Ok&>(__return_storage_ptr__,u);
                local_11c = 1;
              }
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_160,"expected valtype",&local_161);
              ParseInput::err(&local_140,&pPVar1->in,&local_160);
              Result<wasm::WATParser::Ok>::Result(__return_storage_ptr__,&local_140);
              WATParser::Err::~Err(&local_140);
              std::__cxx11::string::~string((string *)&local_160);
              std::allocator<char>::~allocator(&local_161);
              local_11c = 1;
            }
            MaybeResult<wasm::WATParser::Ok>::~MaybeResult
                      ((MaybeResult<wasm::WATParser::Ok> *)local_b8);
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::TypeT> valtype(Ctx& ctx) {
  if (ctx.in.takeKeyword("i32"sv)) {
    return ctx.makeI32();
  } else if (ctx.in.takeKeyword("i64"sv)) {
    return ctx.makeI64();
  } else if (ctx.in.takeKeyword("f32"sv)) {
    return ctx.makeF32();
  } else if (ctx.in.takeKeyword("f64"sv)) {
    return ctx.makeF64();
  } else if (ctx.in.takeKeyword("v128"sv)) {
    return ctx.makeV128();
  } else if (auto type = reftype(ctx)) {
    CHECK_ERR(type);
    return *type;
  } else {
    return ctx.in.err("expected valtype");
  }
}